

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O0

unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
 __thiscall
Diligent::FramebufferCache::CreateDyanmicRenderInfo
          (FramebufferCache *this,FramebufferCacheKey *Key,CreateDyanmicRenderInfoAttribs *Attribs)

{
  pointer pRVar1;
  RenderingInfoWrapper *pRVar2;
  VkRenderingAttachmentInfoKHR *pVVar3;
  VkRenderingFragmentShadingRateAttachmentInfoKHR *pVVar4;
  VkRenderingFragmentShadingRateAttachmentInfoKHR *ShadingRateAttachment;
  VkRenderingAttachmentInfoKHR *StencilAttachment;
  VkRenderingAttachmentInfoKHR *DepthAttachment;
  VkRenderingAttachmentInfoKHR *RTAttachment;
  anon_class_1_0_00000001 local_4d;
  Uint32 rt;
  anon_class_1_0_00000001 InitAttachment;
  VkRect2D local_40;
  size_t local_30;
  undefined1 local_21;
  CreateDyanmicRenderInfoAttribs *local_20;
  CreateDyanmicRenderInfoAttribs *Attribs_local;
  FramebufferCacheKey *Key_local;
  unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
  *RI;
  
  local_21 = 0;
  local_20 = Attribs;
  Attribs_local = (CreateDyanmicRenderInfoAttribs *)Key;
  Key_local = (FramebufferCacheKey *)this;
  local_30 = FramebufferCacheKey::GetHash(Key);
  std::
  make_unique<VulkanUtilities::RenderingInfoWrapper,unsigned_long,unsigned_int_const&,bool_const&,bool_const&>
            ((unsigned_long *)this,(uint *)&local_30,(bool *)&Attribs_local->Layers,
             &local_20->UseDepthAttachment);
  pRVar1 = std::
           unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
           ::operator->((unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
                         *)this);
  local_40.offset.x = 0;
  local_40.offset.y = 0;
  local_40.extent = local_20->Extent;
  pRVar2 = VulkanUtilities::RenderingInfoWrapper::SetRenderArea(pRVar1,&local_40);
  pRVar2 = VulkanUtilities::RenderingInfoWrapper::SetLayerCount(pRVar2,local_20->Layers);
  VulkanUtilities::RenderingInfoWrapper::SetViewMask(pRVar2,local_20->ViewMask);
  for (RTAttachment._4_4_ = 0; RTAttachment._4_4_ < Attribs_local->Layers;
      RTAttachment._4_4_ = RTAttachment._4_4_ + 1) {
    pRVar1 = std::
             unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
             ::operator->((unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
                           *)this);
    pVVar3 = VulkanUtilities::RenderingInfoWrapper::GetColorAttachment(pRVar1,RTAttachment._4_4_);
    CreateDyanmicRenderInfo::anon_class_1_0_00000001::operator()
              (&local_4d,pVVar3,
               *(VkImageView *)(&Attribs_local->UseDepthAttachment + (ulong)RTAttachment._4_4_ * 8),
               VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);
  }
  if ((local_20->UseDepthAttachment & 1U) != 0) {
    pRVar1 = std::
             unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
             ::operator->((unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
                           *)this);
    pVVar3 = VulkanUtilities::RenderingInfoWrapper::GetDepthAttachment(pRVar1);
    CreateDyanmicRenderInfo::anon_class_1_0_00000001::operator()
              (&local_4d,pVVar3,(VkImageView)Attribs_local->ShadingRateTexelSize,
               (local_20->ReadOnlyDepthStencil & 1) +
               VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
  }
  if ((local_20->UseStencilAttachment & 1U) != 0) {
    pRVar1 = std::
             unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
             ::operator->((unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
                           *)this);
    pVVar3 = VulkanUtilities::RenderingInfoWrapper::GetStencilAttachment(pRVar1);
    CreateDyanmicRenderInfo::anon_class_1_0_00000001::operator()
              (&local_4d,pVVar3,(VkImageView)Attribs_local->ShadingRateTexelSize,
               (local_20->ReadOnlyDepthStencil & 1) +
               VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
  }
  if (*(long *)&Attribs_local[3].Extent.height != 0) {
    pRVar1 = std::
             unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
             ::operator->((unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
                           *)this);
    pVVar4 = VulkanUtilities::RenderingInfoWrapper::GetShadingRateAttachment(pRVar1);
    pVVar4->imageView = *(VkImageView *)&Attribs_local[3].Extent.height;
    pVVar4->imageLayout = VK_IMAGE_LAYOUT_FRAGMENT_SHADING_RATE_ATTACHMENT_OPTIMAL_KHR;
    pVVar4->shadingRateAttachmentTexelSize = local_20->ShadingRateTexelSize;
  }
  return (__uniq_ptr_data<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>,_true,_true>
          )(__uniq_ptr_data<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<VulkanUtilities::RenderingInfoWrapper> FramebufferCache::CreateDyanmicRenderInfo(const FramebufferCacheKey&            Key,
                                                                                                 const CreateDyanmicRenderInfoAttribs& Attribs)
{
    std::unique_ptr<VulkanUtilities::RenderingInfoWrapper> RI = std::make_unique<VulkanUtilities::RenderingInfoWrapper>(
        Key.GetHash(), Key.NumRenderTargets, Attribs.UseDepthAttachment, Attribs.UseStencilAttachment);

    RI->SetRenderArea({{0, 0}, Attribs.Extent})
        .SetLayerCount(Attribs.Layers)
        .SetViewMask(Attribs.ViewMask);

    auto InitAttachment = [](VkRenderingAttachmentInfoKHR& Attachment, VkImageView View, VkImageLayout Layout) {
        Attachment.imageView          = View;
        Attachment.imageLayout        = Layout;
        Attachment.resolveMode        = VK_RESOLVE_MODE_NONE_KHR;
        Attachment.resolveImageView   = VK_NULL_HANDLE;
        Attachment.resolveImageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
        Attachment.loadOp             = VK_ATTACHMENT_LOAD_OP_LOAD;
        Attachment.storeOp            = VK_ATTACHMENT_STORE_OP_STORE;
        Attachment.clearValue         = VkClearValue{};
    };

    for (Uint32 rt = 0; rt < Key.NumRenderTargets; ++rt)
    {
        VkRenderingAttachmentInfoKHR& RTAttachment = RI->GetColorAttachment(rt);
        InitAttachment(RTAttachment, Key.RTVs[rt], VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);
    }

    if (Attribs.UseDepthAttachment)
    {
        VkRenderingAttachmentInfoKHR& DepthAttachment = RI->GetDepthAttachment();
        InitAttachment(DepthAttachment, Key.DSV, Attribs.ReadOnlyDepthStencil ? VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL : VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
    }

    if (Attribs.UseStencilAttachment)
    {
        VkRenderingAttachmentInfoKHR& StencilAttachment = RI->GetStencilAttachment();
        InitAttachment(StencilAttachment, Key.DSV, Attribs.ReadOnlyDepthStencil ? VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL : VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
    }

    if (Key.ShadingRate)
    {
        VkRenderingFragmentShadingRateAttachmentInfoKHR& ShadingRateAttachment = RI->GetShadingRateAttachment();

        ShadingRateAttachment.imageView                      = Key.ShadingRate;
        ShadingRateAttachment.imageLayout                    = VK_IMAGE_LAYOUT_FRAGMENT_SHADING_RATE_ATTACHMENT_OPTIMAL_KHR;
        ShadingRateAttachment.shadingRateAttachmentTexelSize = Attribs.ShadingRateTexelSize;
    }

    return RI;
}